

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Container<google::protobuf::UnknownFieldSet> *
google::protobuf::Arena::
Create<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
          (Arena *arena)

{
  Container<google::protobuf::UnknownFieldSet> *pCVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena != (Arena *)0x0) {
    pVar2 = AllocateAlignedWithCleanup
                      (arena,0x20,
                       (type_info *)
                       &internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>::
                        typeinfo);
    pCVar1 = (Container<google::protobuf::UnknownFieldSet> *)pVar2.first;
    (pVar2.second)->elem = pCVar1;
    (pVar2.second)->cleanup =
         internal::
         arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
    ;
    (pCVar1->super_ContainerBase).arena = (Arena *)0x0;
    (pCVar1->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return pCVar1;
  }
  pCVar1 = (Container<google::protobuf::UnknownFieldSet> *)operator_new(0x20);
  (pCVar1->super_ContainerBase).arena = (Arena *)0x0;
  (pCVar1->unknown_fields).fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar1->unknown_fields).fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar1->unknown_fields).fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }